

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::RgbaInputFile::RgbaInputFile(RgbaInputFile *this,IStream *is,int numThreads)

{
  RgbaChannels rgbaChannels;
  InputFile *this_00;
  FromYca *this_01;
  
  this->_vptr_RgbaInputFile = (_func_int **)&PTR__RgbaInputFile_0049d350;
  this_00 = (InputFile *)operator_new(0x10);
  InputFile::InputFile(this_00,is,numThreads);
  this->_inputFile = this_00;
  this->_fromYca = (FromYca *)0x0;
  (this->_channelNamePrefix)._M_dataplus._M_p = (pointer)&(this->_channelNamePrefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_channelNamePrefix,"");
  rgbaChannels = channels(this);
  if (WRITE_RGBA < rgbaChannels) {
    this_01 = (FromYca *)operator_new(0x188);
    FromYca::FromYca(this_01,this->_inputFile,rgbaChannels);
    this->_fromYca = this_01;
  }
  return;
}

Assistant:

RgbaInputFile::RgbaInputFile (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int numThreads):
    _inputFile (new InputFile (is, numThreads)),
    _fromYca (0),
    _channelNamePrefix ("")
{
    RgbaChannels rgbaChannels = channels();

    if (rgbaChannels & (WRITE_Y | WRITE_C))
	_fromYca = new FromYca (*_inputFile, rgbaChannels);
}